

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_log.cpp
# Opt level: O0

void duckdb::WriteLogValues<duckdb::ClientContext_const>
               (ClientContext *LogSource,LogLevel level,string_t *data,SelectionVector *sel,
               idx_t size,string *type)

{
  uint uVar1;
  ulong uVar2;
  Logger *pLVar3;
  undefined8 uVar4;
  string_t *message;
  Logger *pLVar5;
  SelectionVector *in_RCX;
  LogLevel in_SIL;
  ulong in_R8;
  Logger *logger_1;
  idx_t i_1;
  Logger *logger;
  idx_t i;
  string_t *in_stack_ffffffffffffff98;
  LogLevel in_stack_ffffffffffffffa7;
  LogLevel log_level;
  char *in_stack_ffffffffffffffa8;
  Logger *in_stack_ffffffffffffffb0;
  ulong local_48;
  ulong local_38;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    for (local_38 = 0; local_38 < in_R8; local_38 = local_38 + 1) {
      pLVar3 = Logger::Get((ClientContext *)0x13e0c81);
      uVar4 = ::std::__cxx11::string::c_str();
      uVar1 = (*pLVar3->_vptr_Logger[2])(pLVar3,uVar4,(ulong)in_SIL);
      if ((uVar1 & 1) != 0) {
        message = (string_t *)::std::__cxx11::string::c_str();
        log_level = in_SIL;
        SelectionVector::get_index(in_RCX,local_38);
        Logger::WriteLog(in_stack_ffffffffffffffb0,(char *)pLVar3,log_level,message);
      }
    }
  }
  else {
    for (local_48 = 0; local_48 < in_R8; local_48 = local_48 + 1) {
      pLVar5 = Logger::Get((ClientContext *)0x13e0d63);
      pLVar3 = pLVar5;
      uVar4 = ::std::__cxx11::string::c_str();
      uVar1 = (*pLVar5->_vptr_Logger[2])(pLVar5,uVar4,(ulong)in_SIL);
      if ((uVar1 & 1) != 0) {
        ::std::__cxx11::string::c_str();
        SelectionVector::get_index(in_RCX,local_48);
        Logger::WriteLog(pLVar3,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa7,
                         in_stack_ffffffffffffff98);
      }
    }
  }
  return;
}

Assistant:

static void WriteLogValues(T &LogSource, LogLevel level, const string_t *data, const SelectionVector *sel, idx_t size,
                           const string &type) {
	if (!type.empty()) {
		for (idx_t i = 0; i < size; i++) {
			DUCKDB_LOG(LogSource, type.c_str(), level, data[sel->get_index(i)]);
		}
	} else {
		for (idx_t i = 0; i < size; i++) {
			DUCKDB_LOG(LogSource, type.c_str(), level, data[sel->get_index(i)]);
		}
	}
}